

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void migrateUntilParenthesis(list *output,list *operators)

{
  undefined8 *__ptr;
  int iVar1;
  bool bVar2;
  token *tmp;
  list *operators_local;
  list *output_local;
  
  tmp = (token *)operators;
  operators_local = output;
  while( true ) {
    bVar2 = false;
    if (*(long *)&tmp->opcode != 0) {
      iVar1 = strcmp((char *)**(undefined8 **)&tmp->opcode,"(");
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    moveToken(&operators_local,(list **)&tmp);
  }
  if (*(long *)&tmp->opcode != 0) {
    iVar1 = strcmp((char *)**(undefined8 **)&tmp->opcode,"(");
    if (iVar1 == 0) {
      if (tmp->value == *(char **)&tmp->opcode) {
        tmp->value = (char *)0x0;
      }
      __ptr = *(undefined8 **)&tmp->opcode;
      *(undefined8 *)&tmp->opcode = *(undefined8 *)(*(long *)&tmp->opcode + 0x10);
      free((void *)*__ptr);
      free(__ptr);
    }
  }
  return;
}

Assistant:

static void migrateUntilParenthesis(struct list *output,
                                    struct list *operators)
{
    struct token *tmp;

    while (operators->last != NULL &&
        strcmp(operators->last->value, "(") != 0) {
        moveToken(&output, &operators);
    }

    if (operators->last != NULL && !strcmp(operators->last->value, "(")) {
        if (operators->first == operators->last) {
            operators->first = NULL;
        }

        tmp = operators->last;
        operators->last = operators->last->prev;
        free(tmp->value);
        free(tmp);
    }
}